

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O1

void inputParticle(Particle *particle,int filenum,char *seq)

{
  char *pcVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  int ss;
  int iVar8;
  int iVar9;
  ifstream inFile;
  char buffer [256];
  undefined1 auStack_368 [12];
  int local_35c;
  undefined8 local_358;
  char *local_350;
  char *local_348;
  double local_340 [4];
  byte abStack_320 [488];
  undefined1 local_138 [264];
  
  local_358 = CONCAT44(in_register_00000034,filenum);
  std::ifstream::ifstream(local_340);
  pcVar1 = catStrStr(inputAddress,"particleO_");
  ss = (int)local_358 + 1;
  pcVar1 = catStrIntStr(pcVar1,ss,".txt");
  openFile(pcVar1,(ifstream *)local_340);
  lVar6 = *(long *)((long)local_340[0] + -0x18);
  iVar9 = 0;
  local_350 = pcVar1;
  if ((abStack_320[lVar6] & 2) == 0) {
    iVar9 = 0;
    do {
      std::ios::widen((char)auStack_368 + (char)lVar6 + '(');
      std::istream::getline((char *)local_340,(long)local_138,'\0');
      iVar9 = iVar9 + 1;
      lVar6 = *(long *)((long)local_340[0] + -0x18);
    } while ((abStack_320[lVar6] & 2) == 0);
  }
  iVar5 = iVar9 + -1;
  iVar8 = iVar9 + 2;
  if (-1 < iVar5) {
    iVar8 = iVar5;
  }
  particle->numAA = iVar8 >> 2;
  particle->numAtom = (iVar8 >> 2) * 3;
  std::ifstream::close();
  openFile(local_350,(ifstream *)local_340);
  pdVar2 = (double *)operator_new__(-(ulong)(iVar9 == 0) | (long)(iVar5 * 3) << 3);
  particle->addO_origin = pdVar2;
  iVar9 = particle->numAA * 9;
  uVar4 = 0xffffffffffffffff;
  if (-1 < iVar9) {
    uVar4 = (long)iVar9 * 8;
  }
  pdVar2 = (double *)operator_new__(uVar4);
  particle->origin = pdVar2;
  iVar9 = particle->numAA;
  if (iVar9 < 1) {
    uVar4 = (ulong)(uint)(iVar9 * 0xc);
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    iVar8 = 0;
    local_35c = ss;
    local_348 = seq;
    do {
      std::istream::_M_extract<double>(local_340);
      if ((uint)((int)uVar7 + (int)((uVar7 & 0xffffffff) / 0xc) * -0xc) < 9) {
        lVar3 = (long)iVar8;
        iVar8 = iVar8 + 1;
        particle->origin[lVar3] = *(double *)((long)particle->addO_origin + lVar6);
      }
      uVar7 = uVar7 + 1;
      iVar9 = particle->numAA;
      uVar4 = (long)iVar9 * 0xc;
      lVar6 = lVar6 + 8;
      seq = local_348;
      ss = local_35c;
    } while (SBORROW8(uVar7,uVar4) != (long)(uVar7 + (long)iVar9 * -0xc) < 0);
  }
  particle->sizeOfAddO_origin = (int)uVar4;
  particle->sizeOfOrigin = iVar9 * 9;
  std::ifstream::close();
  if (local_350 != (char *)0x0) {
    operator_delete(local_350);
  }
  pcVar1 = catStrStr(inputAddress,"phi");
  pcVar1 = catStrIntStr(pcVar1,ss,".txt");
  openFile(pcVar1,(ifstream *)local_340);
  uVar4 = 0xffffffffffffffff;
  if (0 < (long)particle->numAA) {
    uVar4 = (long)particle->numAA * 0x18 - 0x18;
  }
  pdVar2 = (double *)operator_new__(uVar4);
  particle->Position = pdVar2;
  if (1 < particle->numAA) {
    lVar6 = 0x10;
    lVar3 = 0;
    do {
      std::istream::_M_extract<double>(local_340);
      *(undefined8 *)((long)particle->Position + lVar6 + -8) = 0x4066800000000000;
      std::istream::_M_extract<double>(local_340);
      lVar3 = lVar3 + 3;
      lVar6 = lVar6 + 0x18;
    } while (lVar3 < (long)particle->numAA * 3 + -5);
  }
  std::ifstream::close();
  particle->sizeOfPosition = particle->numAA * 3 + -3;
  pdVar2 = (double *)operator_new__(8);
  particle->Cost = pdVar2;
  particle->index = (int)local_358;
  particle->seq = seq;
  std::ifstream::~ifstream(local_340);
  return;
}

Assistant:

void inputParticle(Particle &particle, int filenum, char *seq){
    ifstream inFile;
    char *fileAddress;
    char *filename;
    fileAddress = catStrStr(inputAddress, "particleO_");
    filename = catStrIntStr(fileAddress, filenum+1, ".txt");
    openFile(filename, inFile);
    char buffer[256];
    // get the number of lines of the input file
    int cntLines = 0;
    while (! inFile.eof()) { inFile.getline(buffer, 256); cntLines++; }
    cntLines--;
    particle.numAA = cntLines/4;                                            // the number of AA
    particle.numAtom = particle.numAA *3;                          // the number of atoms ( not add O)
    inFile.close();                                                                         //get how many lines the input has

    // read the file to get the coordinaries
    openFile(filename, inFile);
    particle.addO_origin = new double[3*cntLines];                  //  the x,y,z of every atoms in the particle
    particle.origin = new double[particle.numAA*3 *3];          //  x,y,z, delete the number of the atom O
    int k=0;
    //  read the file by lines
    for (int j=0; j<12 * particle.numAA; j++){
        inFile >> particle.addO_origin[j];
        if (j % 12<9)
            particle.origin[k++] = particle.addO_origin[j];
    }
    particle.sizeOfAddO_origin = particle.numAA*4*3;
    particle.sizeOfOrigin = particle.numAA*3*3;                 //  the totally number of coordinaries
    inFile.close();
    delete filename;

    //  read the init angles
    fileAddress = catStrStr(inputAddress, "phi");
    filename = catStrIntStr(fileAddress, filenum+1, ".txt");
    openFile(filename, inFile);
    particle.Position = new double[3 * particle.numAA-3];     //   why so many 180  ?

    for (int j=0; j< 3*particle.numAA-5; j+=3){          // last : j=3*numAA-6; j+2=3*numAA-4
        inFile >> particle.Position[j] ;
        particle.Position[j+1] = 180;
        inFile >> particle.Position[j+2] ;
    }

    inFile.close();
    particle.sizeOfPosition = 3*particle.numAA-3;

    //  init particle.cost[]
    particle.Cost = new double [numObjective];

    particle.index = filenum;
    particle.seq = seq;

}